

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t pax_attribute(archive_read *a,tar *tar,archive_entry *entry,char *key,char *value)

{
  wchar_t wVar1;
  int iVar2;
  size_t sVar3;
  archive_string_conv *paVar4;
  archive_acl *paVar5;
  dev_t dVar6;
  unsigned_long uVar7;
  aest *paVar8;
  char *pcVar9;
  size_t sVar10;
  int64_t iVar11;
  size_t local_180;
  size_t local_150;
  size_t local_138;
  size_t local_120;
  size_t local_98;
  wchar_t local_4c;
  wchar_t r;
  wchar_t err;
  long n;
  int64_t s;
  char *value_local;
  char *key_local;
  archive_entry *entry_local;
  tar *tar_local;
  archive_read *a_local;
  
  local_4c = L'\0';
  s = (int64_t)value;
  if (value == (char *)0x0) {
    s = (long)"PK\x01\x02" + 4;
  }
  value_local = key;
  key_local = (char *)entry;
  entry_local = (archive_entry *)tar;
  tar_local = (tar *)a;
  switch(*key) {
  case 'G':
    iVar2 = strcmp(key,"GNU.sparse.numblocks");
    if (iVar2 == 0) {
      (entry_local->ae_gname).aes_mbs.length = 0xffffffffffffffff;
      (entry_local->ae_gname).aes_mbs.buffer_length = 0xffffffffffffffff;
      *(undefined4 *)&(entry_local->ae_gname).aes_utf8.s = 0;
      *(undefined4 *)((long)&(entry_local->ae_gname).aes_utf8.s + 4) = 0;
    }
    iVar2 = strcmp(value_local,"GNU.sparse.offset");
    iVar11 = s;
    if (iVar2 == 0) {
      sVar10 = strlen((char *)s);
      sVar3 = tar_atol10((char *)iVar11,sVar10);
      (entry_local->ae_gname).aes_mbs.length = sVar3;
      if ((entry_local->ae_gname).aes_mbs.buffer_length != 0xffffffffffffffff) {
        wVar1 = gnu_add_sparse_entry
                          ((archive_read *)tar_local,(tar *)entry_local,
                           (entry_local->ae_gname).aes_mbs.length,
                           (entry_local->ae_gname).aes_mbs.buffer_length);
        if (wVar1 != L'\0') {
          return L'\xffffffe2';
        }
        (entry_local->ae_gname).aes_mbs.length = 0xffffffffffffffff;
        (entry_local->ae_gname).aes_mbs.buffer_length = 0xffffffffffffffff;
      }
    }
    iVar2 = strcmp(value_local,"GNU.sparse.numbytes");
    iVar11 = s;
    if (iVar2 == 0) {
      sVar10 = strlen((char *)s);
      sVar3 = tar_atol10((char *)iVar11,sVar10);
      (entry_local->ae_gname).aes_mbs.buffer_length = sVar3;
      if ((entry_local->ae_gname).aes_mbs.buffer_length != 0xffffffffffffffff) {
        wVar1 = gnu_add_sparse_entry
                          ((archive_read *)tar_local,(tar *)entry_local,
                           (entry_local->ae_gname).aes_mbs.length,
                           (entry_local->ae_gname).aes_mbs.buffer_length);
        if (wVar1 != L'\0') {
          return L'\xffffffe2';
        }
        (entry_local->ae_gname).aes_mbs.length = 0xffffffffffffffff;
        (entry_local->ae_gname).aes_mbs.buffer_length = 0xffffffffffffffff;
      }
    }
    iVar2 = strcmp(value_local,"GNU.sparse.size");
    iVar11 = s;
    if (iVar2 == 0) {
      sVar10 = strlen((char *)s);
      uVar7 = tar_atol10((char *)iVar11,sVar10);
      entry_local->ae_fflags_set = uVar7;
      archive_entry_set_size((archive_entry *)key_local,entry_local->ae_fflags_set);
    }
    iVar2 = strcmp(value_local,"GNU.sparse.map");
    if (iVar2 == 0) {
      *(undefined4 *)&(entry_local->ae_gname).aes_utf8.s = 0;
      *(undefined4 *)((long)&(entry_local->ae_gname).aes_utf8.s + 4) = 1;
      wVar1 = gnu_sparse_01_parse((archive_read *)tar_local,(tar *)entry_local,(char *)s);
      if (wVar1 != L'\0') {
        return L'\xffffffec';
      }
    }
    iVar2 = strcmp(value_local,"GNU.sparse.major");
    iVar11 = s;
    if (iVar2 == 0) {
      sVar10 = strlen((char *)s);
      iVar11 = tar_atol10((char *)iVar11,sVar10);
      *(int *)&(entry_local->ae_gname).aes_utf8.s = (int)iVar11;
      *(undefined1 *)&(entry_local->ae_gname).aes_utf8.length = 1;
    }
    iVar2 = strcmp(value_local,"GNU.sparse.minor");
    iVar11 = s;
    if (iVar2 == 0) {
      sVar10 = strlen((char *)s);
      iVar11 = tar_atol10((char *)iVar11,sVar10);
      *(int *)((long)&(entry_local->ae_gname).aes_utf8.s + 4) = (int)iVar11;
      *(undefined1 *)&(entry_local->ae_gname).aes_utf8.length = 1;
    }
    iVar2 = strcmp(value_local,"GNU.sparse.name");
    iVar11 = s;
    if (iVar2 == 0) {
      (entry_local->ae_stat).aest_mtime = 0;
      paVar8 = &entry_local->ae_stat;
      if (s == 0) {
        local_98 = 0;
      }
      else {
        local_98 = strlen((char *)s);
      }
      archive_strncat((archive_string *)&paVar8->aest_ctime_nsec,(void *)iVar11,local_98);
    }
    iVar2 = strcmp(value_local,"GNU.sparse.realsize");
    iVar11 = s;
    if (iVar2 == 0) {
      sVar10 = strlen((char *)s);
      uVar7 = tar_atol10((char *)iVar11,sVar10);
      entry_local->ae_fflags_set = uVar7;
      archive_entry_set_size((archive_entry *)key_local,entry_local->ae_fflags_set);
    }
    break;
  case 'L':
    iVar2 = strcmp(key,"LIBARCHIVE.creationtime");
    if (iVar2 == 0) {
      pax_time((char *)s,&n,(long *)&r);
      archive_entry_set_birthtime((archive_entry *)key_local,n,_r);
    }
    iVar2 = memcmp(value_local,"LIBARCHIVE.xattr.",0x11);
    if (iVar2 == 0) {
      pax_attribute_xattr((archive_entry *)key_local,value_local,(char *)s);
    }
    break;
  case 'S':
    iVar2 = strcmp(key,"SCHILY.acl.access");
    if (iVar2 == 0) {
      if ((entry_local->ae_gname).aes_mbs_in_locale.length == 0) {
        paVar4 = archive_string_conversion_from_charset((archive *)tar_local,"UTF-8",L'\x01');
        (entry_local->ae_gname).aes_mbs_in_locale.length = (size_t)paVar4;
        if ((entry_local->ae_gname).aes_mbs_in_locale.length == 0) {
          return L'\xffffffe2';
        }
      }
      paVar5 = archive_entry_acl((archive_entry *)key_local);
      wVar1 = archive_acl_parse_l(paVar5,(char *)s,L'Ā',
                                  (archive_string_conv *)
                                  (entry_local->ae_gname).aes_mbs_in_locale.length);
      if (wVar1 != L'\0') {
        if (wVar1 == L'\xffffffe2') {
          archive_set_error((archive *)tar_local,0xc,"Can\'t allocate memory for SCHILY.acl.access")
          ;
          return L'\xffffffe2';
        }
        archive_set_error((archive *)tar_local,-1,"Parse error: SCHILY.acl.access");
        local_4c = wVar1;
      }
    }
    else {
      iVar2 = strcmp(value_local,"SCHILY.acl.default");
      if (iVar2 == 0) {
        if ((entry_local->ae_gname).aes_mbs_in_locale.length == 0) {
          paVar4 = archive_string_conversion_from_charset((archive *)tar_local,"UTF-8",L'\x01');
          (entry_local->ae_gname).aes_mbs_in_locale.length = (size_t)paVar4;
          if ((entry_local->ae_gname).aes_mbs_in_locale.length == 0) {
            return L'\xffffffe2';
          }
        }
        paVar5 = archive_entry_acl((archive_entry *)key_local);
        wVar1 = archive_acl_parse_l(paVar5,(char *)s,L'Ȁ',
                                    (archive_string_conv *)
                                    (entry_local->ae_gname).aes_mbs_in_locale.length);
        if (wVar1 != L'\0') {
          if (wVar1 == L'\xffffffe2') {
            archive_set_error((archive *)tar_local,0xc,
                              "Can\'t allocate memory for SCHILY.acl.default");
            return L'\xffffffe2';
          }
          archive_set_error((archive *)tar_local,-1,"Parse error: SCHILY.acl.default");
          local_4c = wVar1;
        }
      }
      else {
        iVar2 = strcmp(value_local,"SCHILY.devmajor");
        pcVar9 = key_local;
        iVar11 = s;
        if (iVar2 == 0) {
          sVar10 = strlen((char *)s);
          dVar6 = tar_atol10((char *)iVar11,sVar10);
          archive_entry_set_rdevmajor((archive_entry *)pcVar9,dVar6);
        }
        else {
          iVar2 = strcmp(value_local,"SCHILY.devminor");
          pcVar9 = key_local;
          iVar11 = s;
          if (iVar2 == 0) {
            sVar10 = strlen((char *)s);
            dVar6 = tar_atol10((char *)iVar11,sVar10);
            archive_entry_set_rdevminor((archive_entry *)pcVar9,dVar6);
          }
          else {
            iVar2 = strcmp(value_local,"SCHILY.fflags");
            if (iVar2 == 0) {
              archive_entry_copy_fflags_text((archive_entry *)key_local,(char *)s);
            }
            else {
              iVar2 = strcmp(value_local,"SCHILY.dev");
              pcVar9 = key_local;
              iVar11 = s;
              if (iVar2 == 0) {
                sVar10 = strlen((char *)s);
                dVar6 = tar_atol10((char *)iVar11,sVar10);
                archive_entry_set_dev((archive_entry *)pcVar9,dVar6);
              }
              else {
                iVar2 = strcmp(value_local,"SCHILY.ino");
                pcVar9 = key_local;
                iVar11 = s;
                if (iVar2 == 0) {
                  sVar10 = strlen((char *)s);
                  iVar11 = tar_atol10((char *)iVar11,sVar10);
                  archive_entry_set_ino((archive_entry *)pcVar9,iVar11);
                }
                else {
                  iVar2 = strcmp(value_local,"SCHILY.nlink");
                  pcVar9 = key_local;
                  iVar11 = s;
                  if (iVar2 == 0) {
                    sVar10 = strlen((char *)s);
                    iVar11 = tar_atol10((char *)iVar11,sVar10);
                    archive_entry_set_nlink((archive_entry *)pcVar9,(uint)iVar11);
                  }
                  else {
                    iVar2 = strcmp(value_local,"SCHILY.realsize");
                    iVar11 = s;
                    if (iVar2 == 0) {
                      sVar10 = strlen((char *)s);
                      uVar7 = tar_atol10((char *)iVar11,sVar10);
                      entry_local->ae_fflags_set = uVar7;
                      archive_entry_set_size((archive_entry *)key_local,entry_local->ae_fflags_set);
                    }
                    else {
                      iVar2 = strcmp(value_local,"SUN.holesdata");
                      if ((iVar2 == 0) &&
                         (wVar1 = solaris_sparse_parse
                                            ((archive_read *)tar_local,(tar *)entry_local,
                                             (archive_entry *)key_local,(char *)s), wVar1 < L'\0'))
                      {
                        if (wVar1 == L'\xffffffe2') {
                          return L'\xffffffe2';
                        }
                        archive_set_error((archive *)tar_local,-1,"Parse error: SUN.holesdata");
                        local_4c = wVar1;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    break;
  case 'a':
    iVar2 = strcmp(key,"atime");
    if (iVar2 == 0) {
      pax_time((char *)s,&n,(long *)&r);
      archive_entry_set_atime((archive_entry *)key_local,n,_r);
    }
    break;
  case 'c':
    iVar2 = strcmp(key,"ctime");
    if (iVar2 == 0) {
      pax_time((char *)s,&n,(long *)&r);
      archive_entry_set_ctime((archive_entry *)key_local,n,_r);
    }
    else {
      iVar2 = strcmp(value_local,"charset");
      if (iVar2 != 0) {
        strcmp(value_local,"comment");
      }
    }
    break;
  case 'g':
    iVar2 = strcmp(key,"gid");
    pcVar9 = key_local;
    iVar11 = s;
    if (iVar2 == 0) {
      sVar10 = strlen((char *)s);
      iVar11 = tar_atol10((char *)iVar11,sVar10);
      archive_entry_set_gid((archive_entry *)pcVar9,iVar11);
    }
    else {
      iVar2 = strcmp(value_local,"gname");
      iVar11 = s;
      if (iVar2 == 0) {
        *(undefined8 *)&(entry_local->ae_stat).aest_dev_is_broken_down = 0;
        paVar8 = &entry_local->ae_stat;
        if (s == 0) {
          local_120 = 0;
        }
        else {
          local_120 = strlen((char *)s);
        }
        archive_strncat((archive_string *)&paVar8->aest_uid,(void *)iVar11,local_120);
      }
    }
    break;
  case 'h':
    iVar2 = strcmp(key,"hdrcharset");
    if (iVar2 == 0) {
      iVar2 = strcmp((char *)s,"BINARY");
      if (iVar2 == 0) {
        *(undefined4 *)&(entry_local->ae_fflags_text).aes_wcs.buffer_length = 1;
      }
      else {
        iVar2 = strcmp((char *)s,"ISO-IR 10646 2000 UTF-8");
        if (iVar2 == 0) {
          *(undefined4 *)&(entry_local->ae_fflags_text).aes_wcs.buffer_length = 0;
        }
      }
    }
    break;
  case 'l':
    iVar2 = strcmp(key,"linkpath");
    iVar11 = s;
    if (iVar2 == 0) {
      *(undefined8 *)&(entry_local->ae_stat).aest_birthtime_nsec = 0;
      paVar8 = &entry_local->ae_stat;
      if (s == 0) {
        local_138 = 0;
      }
      else {
        local_138 = strlen((char *)s);
      }
      archive_strncat((archive_string *)&paVar8->aest_birthtime,(void *)iVar11,local_138);
    }
    break;
  case 'm':
    iVar2 = strcmp(key,"mtime");
    if (iVar2 == 0) {
      pax_time((char *)s,&n,(long *)&r);
      archive_entry_set_mtime((archive_entry *)key_local,n,_r);
    }
    break;
  case 'p':
    iVar2 = strcmp(key,"path");
    iVar11 = s;
    if (iVar2 == 0) {
      *(undefined8 *)&(entry_local->ae_stat).aest_atime_nsec = 0;
      paVar8 = &entry_local->ae_stat;
      if (s == 0) {
        local_150 = 0;
      }
      else {
        local_150 = strlen((char *)s);
      }
      archive_strncat((archive_string *)paVar8,(void *)iVar11,local_150);
    }
    break;
  case 'r':
    break;
  case 's':
    iVar2 = strcmp(key,"size");
    iVar11 = s;
    if (iVar2 == 0) {
      sVar10 = strlen((char *)s);
      pcVar9 = (char *)tar_atol10((char *)iVar11,sVar10);
      (entry_local->ae_fflags_text).aes_mbs_in_locale.s = pcVar9;
      if ((long)entry_local->ae_fflags_set < 0) {
        archive_entry_set_size
                  ((archive_entry *)key_local,
                   (int64_t)(entry_local->ae_fflags_text).aes_mbs_in_locale.s);
        entry_local->ae_fflags_set =
             (unsigned_long)(entry_local->ae_fflags_text).aes_mbs_in_locale.s;
      }
    }
    break;
  case 'u':
    iVar2 = strcmp(key,"uid");
    pcVar9 = key_local;
    iVar11 = s;
    if (iVar2 == 0) {
      sVar10 = strlen((char *)s);
      iVar11 = tar_atol10((char *)iVar11,sVar10);
      archive_entry_set_uid((archive_entry *)pcVar9,iVar11);
    }
    else {
      iVar2 = strcmp(value_local,"uname");
      iVar11 = s;
      if (iVar2 == 0) {
        *(undefined8 *)&(entry_local->ae_stat).aest_nlink = 0;
        paVar8 = &entry_local->ae_stat;
        if (s == 0) {
          local_180 = 0;
        }
        else {
          local_180 = strlen((char *)s);
        }
        archive_strncat((archive_string *)&paVar8->aest_ino,(void *)iVar11,local_180);
      }
    }
  }
  return local_4c;
}

Assistant:

static int
pax_attribute(struct archive_read *a, struct tar *tar,
    struct archive_entry *entry, char *key, char *value)
{
	int64_t s;
	long n;
	int err = ARCHIVE_OK, r;

	if (value == NULL)
		value = "";	/* Disable compiler warning; do not pass
				 * NULL pointer to strlen().  */
	switch (key[0]) {
	case 'G':
		/* GNU "0.0" sparse pax format. */
		if (strcmp(key, "GNU.sparse.numblocks") == 0) {
			tar->sparse_offset = -1;
			tar->sparse_numbytes = -1;
			tar->sparse_gnu_major = 0;
			tar->sparse_gnu_minor = 0;
		}
		if (strcmp(key, "GNU.sparse.offset") == 0) {
			tar->sparse_offset = tar_atol10(value, strlen(value));
			if (tar->sparse_numbytes != -1) {
				if (gnu_add_sparse_entry(a, tar,
				    tar->sparse_offset, tar->sparse_numbytes)
				    != ARCHIVE_OK)
					return (ARCHIVE_FATAL);
				tar->sparse_offset = -1;
				tar->sparse_numbytes = -1;
			}
		}
		if (strcmp(key, "GNU.sparse.numbytes") == 0) {
			tar->sparse_numbytes = tar_atol10(value, strlen(value));
			if (tar->sparse_numbytes != -1) {
				if (gnu_add_sparse_entry(a, tar,
				    tar->sparse_offset, tar->sparse_numbytes)
				    != ARCHIVE_OK)
					return (ARCHIVE_FATAL);
				tar->sparse_offset = -1;
				tar->sparse_numbytes = -1;
			}
		}
		if (strcmp(key, "GNU.sparse.size") == 0) {
			tar->realsize = tar_atol10(value, strlen(value));
			archive_entry_set_size(entry, tar->realsize);
		}

		/* GNU "0.1" sparse pax format. */
		if (strcmp(key, "GNU.sparse.map") == 0) {
			tar->sparse_gnu_major = 0;
			tar->sparse_gnu_minor = 1;
			if (gnu_sparse_01_parse(a, tar, value) != ARCHIVE_OK)
				return (ARCHIVE_WARN);
		}

		/* GNU "1.0" sparse pax format */
		if (strcmp(key, "GNU.sparse.major") == 0) {
			tar->sparse_gnu_major = (int)tar_atol10(value, strlen(value));
			tar->sparse_gnu_pending = 1;
		}
		if (strcmp(key, "GNU.sparse.minor") == 0) {
			tar->sparse_gnu_minor = (int)tar_atol10(value, strlen(value));
			tar->sparse_gnu_pending = 1;
		}
		if (strcmp(key, "GNU.sparse.name") == 0) {
			/*
			 * The real filename; when storing sparse
			 * files, GNU tar puts a synthesized name into
			 * the regular 'path' attribute in an attempt
			 * to limit confusion. ;-)
			 */
			archive_strcpy(&(tar->entry_pathname_override), value);
		}
		if (strcmp(key, "GNU.sparse.realsize") == 0) {
			tar->realsize = tar_atol10(value, strlen(value));
			archive_entry_set_size(entry, tar->realsize);
		}
		break;
	case 'L':
		/* Our extensions */
/* TODO: Handle arbitrary extended attributes... */
/*
		if (strcmp(key, "LIBARCHIVE.xxxxxxx") == 0)
			archive_entry_set_xxxxxx(entry, value);
*/
		if (strcmp(key, "LIBARCHIVE.creationtime") == 0) {
			pax_time(value, &s, &n);
			archive_entry_set_birthtime(entry, s, n);
		}
		if (memcmp(key, "LIBARCHIVE.xattr.", 17) == 0)
			pax_attribute_xattr(entry, key, value);
		break;
	case 'S':
		/* We support some keys used by the "star" archiver */
		if (strcmp(key, "SCHILY.acl.access") == 0) {
			if (tar->sconv_acl == NULL) {
				tar->sconv_acl =
				    archive_string_conversion_from_charset(
					&(a->archive), "UTF-8", 1);
				if (tar->sconv_acl == NULL)
					return (ARCHIVE_FATAL);
			}

			r = archive_acl_parse_l(archive_entry_acl(entry),
			    value, ARCHIVE_ENTRY_ACL_TYPE_ACCESS,
			    tar->sconv_acl);
			if (r != ARCHIVE_OK) {
				err = r;
				if (err == ARCHIVE_FATAL) {
					archive_set_error(&a->archive, ENOMEM,
					    "Can't allocate memory for "
					    "SCHILY.acl.access");
					return (err);
				}
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Parse error: SCHILY.acl.access");
			}
		} else if (strcmp(key, "SCHILY.acl.default") == 0) {
			if (tar->sconv_acl == NULL) {
				tar->sconv_acl =
				    archive_string_conversion_from_charset(
					&(a->archive), "UTF-8", 1);
				if (tar->sconv_acl == NULL)
					return (ARCHIVE_FATAL);
			}

			r = archive_acl_parse_l(archive_entry_acl(entry),
			    value, ARCHIVE_ENTRY_ACL_TYPE_DEFAULT,
			    tar->sconv_acl);
			if (r != ARCHIVE_OK) {
				err = r;
				if (err == ARCHIVE_FATAL) {
					archive_set_error(&a->archive, ENOMEM,
					    "Can't allocate memory for "
					    "SCHILY.acl.default");
					return (err);
				}
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Parse error: SCHILY.acl.default");
			}
		} else if (strcmp(key, "SCHILY.devmajor") == 0) {
			archive_entry_set_rdevmajor(entry,
			    (dev_t)tar_atol10(value, strlen(value)));
		} else if (strcmp(key, "SCHILY.devminor") == 0) {
			archive_entry_set_rdevminor(entry,
			    (dev_t)tar_atol10(value, strlen(value)));
		} else if (strcmp(key, "SCHILY.fflags") == 0) {
			archive_entry_copy_fflags_text(entry, value);
		} else if (strcmp(key, "SCHILY.dev") == 0) {
			archive_entry_set_dev(entry,
			    (dev_t)tar_atol10(value, strlen(value)));
		} else if (strcmp(key, "SCHILY.ino") == 0) {
			archive_entry_set_ino(entry,
			    tar_atol10(value, strlen(value)));
		} else if (strcmp(key, "SCHILY.nlink") == 0) {
			archive_entry_set_nlink(entry, (unsigned)
			    tar_atol10(value, strlen(value)));
		} else if (strcmp(key, "SCHILY.realsize") == 0) {
			tar->realsize = tar_atol10(value, strlen(value));
			archive_entry_set_size(entry, tar->realsize);
		} else if (strcmp(key, "SUN.holesdata") == 0) {
			/* A Solaris extension for sparse. */
			r = solaris_sparse_parse(a, tar, entry, value);
			if (r < err) {
				if (r == ARCHIVE_FATAL)
					return (r);
				err = r;
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Parse error: SUN.holesdata");
			}
		}
		break;
	case 'a':
		if (strcmp(key, "atime") == 0) {
			pax_time(value, &s, &n);
			archive_entry_set_atime(entry, s, n);
		}
		break;
	case 'c':
		if (strcmp(key, "ctime") == 0) {
			pax_time(value, &s, &n);
			archive_entry_set_ctime(entry, s, n);
		} else if (strcmp(key, "charset") == 0) {
			/* TODO: Publish charset information in entry. */
		} else if (strcmp(key, "comment") == 0) {
			/* TODO: Publish comment in entry. */
		}
		break;
	case 'g':
		if (strcmp(key, "gid") == 0) {
			archive_entry_set_gid(entry,
			    tar_atol10(value, strlen(value)));
		} else if (strcmp(key, "gname") == 0) {
			archive_strcpy(&(tar->entry_gname), value);
		}
		break;
	case 'h':
		if (strcmp(key, "hdrcharset") == 0) {
			if (strcmp(value, "BINARY") == 0)
				/* Binary  mode. */
				tar->pax_hdrcharset_binary = 1;
			else if (strcmp(value, "ISO-IR 10646 2000 UTF-8") == 0)
				tar->pax_hdrcharset_binary = 0;
		}
		break;
	case 'l':
		/* pax interchange doesn't distinguish hardlink vs. symlink. */
		if (strcmp(key, "linkpath") == 0) {
			archive_strcpy(&(tar->entry_linkpath), value);
		}
		break;
	case 'm':
		if (strcmp(key, "mtime") == 0) {
			pax_time(value, &s, &n);
			archive_entry_set_mtime(entry, s, n);
		}
		break;
	case 'p':
		if (strcmp(key, "path") == 0) {
			archive_strcpy(&(tar->entry_pathname), value);
		}
		break;
	case 'r':
		/* POSIX has reserved 'realtime.*' */
		break;
	case 's':
		/* POSIX has reserved 'security.*' */
		/* Someday: if (strcmp(key, "security.acl") == 0) { ... } */
		if (strcmp(key, "size") == 0) {
			/* "size" is the size of the data in the entry. */
			tar->entry_bytes_remaining
			    = tar_atol10(value, strlen(value));
			/*
			 * But, "size" is not necessarily the size of
			 * the file on disk; if this is a sparse file,
			 * the disk size may have already been set from
			 * GNU.sparse.realsize or GNU.sparse.size or
			 * an old GNU header field or SCHILY.realsize
			 * or ....
			 */
			if (tar->realsize < 0) {
				archive_entry_set_size(entry,
				    tar->entry_bytes_remaining);
				tar->realsize
				    = tar->entry_bytes_remaining;
			}
		}
		break;
	case 'u':
		if (strcmp(key, "uid") == 0) {
			archive_entry_set_uid(entry,
			    tar_atol10(value, strlen(value)));
		} else if (strcmp(key, "uname") == 0) {
			archive_strcpy(&(tar->entry_uname), value);
		}
		break;
	}
	return (err);
}